

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgp.cpp
# Opt level: O0

size_t encode_bgp_capabilities_to_buffer(uchar *buffer,size_t start_point)

{
  uint16_t uVar1;
  uint32_t uVar2;
  uint32_t asn;
  uint16_t afi;
  size_t pointer;
  size_t start_point_local;
  uchar *buffer_local;
  
  buffer[start_point] = '\x02';
  buffer[start_point + 1] = '\x06';
  buffer[start_point + 2] = '\x01';
  buffer[start_point + 3] = '\x04';
  uVar1 = htons(1);
  *(uint16_t *)(buffer + start_point + 4) = uVar1;
  buffer[start_point + 6] = '\0';
  buffer[start_point + 7] = '\x01';
  buffer[start_point + 8] = '\x02';
  buffer[start_point + 9] = '\x06';
  buffer[start_point + 10] = 'A';
  buffer[start_point + 0xb] = '\x04';
  uVar2 = htonl(my_as);
  *(uint32_t *)(buffer + start_point + 0xc) = uVar2;
  return 0x10;
}

Assistant:

size_t encode_bgp_capabilities_to_buffer(unsigned char* buffer, size_t start_point){
    size_t pointer = start_point;

    /** MP BGP **/
    buffer[pointer++] = CAPABILITIES;
    buffer[pointer++] = 6;
    buffer[pointer++] = MULTIPROTOCOL_EXTENSION_FOR_BGP4;
    buffer[pointer++] = 4;
    uint16_t afi = htons(afi::IPV4);
    memcpy(&buffer[pointer], &afi, 2);
    pointer += 2;
    buffer[pointer++] = 0; // Reserved
    buffer[pointer++] = safi::UNICAST;

    /** 4-octet AS number **/
    buffer[pointer++] = CAPABILITIES;
    buffer[pointer++] = 6;
    buffer[pointer++] = SUPPORT_FOR_4_OCTET_AS_NUMBER_CAPABILITY;
    buffer[pointer++] = 4;
    uint32_t asn = htonl(my_as);
    memcpy(&buffer[pointer], &asn, 4);
    pointer += 4;

    return pointer - start_point;
}